

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall xmrig::Worker::storeStats(Worker *this)

{
  undefined8 uVar1;
  uint64_t uVar2;
  long in_RDI;
  memory_order __b_1;
  memory_order __b;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x30);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(undefined8 *)(in_RDI + 0x18) = uVar1;
  uVar2 = Chrono::highResolutionMSecs();
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(uint64_t *)(in_RDI + 0x20) = uVar2;
  return;
}

Assistant:

void xmrig::Worker::storeStats()
{
    m_hashCount.store(m_count, std::memory_order_relaxed);
    m_timestamp.store(Chrono::highResolutionMSecs(), std::memory_order_relaxed);
}